

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndTable(void)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  ImDrawListSplitter *this;
  ImGuiTableColumn *pIVar3;
  ImVec4 *v;
  uint *puVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  ImPoolIdx local_e4;
  ImGuiTable *local_e0;
  ImGuiTableTempData *local_d8;
  float local_c8;
  float local_c0;
  float local_b0;
  float decoration_size_1;
  float decoration_size;
  ImVec2 local_98;
  ImVec2 backup_outer_max_pos;
  float new_width;
  float new_x2;
  ImGuiTableColumn *column_2;
  ImGuiTableColumn *column_1;
  float neighbor_width_to_keep_visible;
  ImGuiTableColumn *column;
  int column_n;
  float width_spacings;
  ImDrawListSplitter *splitter;
  ImVec2 local_4c;
  float local_44;
  float local_40;
  float max_pos_x;
  float outer_padding_for_border;
  float inner_content_max_y;
  ImGuiTableTempData *temp_data;
  ImGuiWindow *outer_window;
  ImGuiWindow *inner_window;
  ImGuiTable *pIStack_18;
  ImGuiTableFlags flags;
  ImGuiTable *table;
  ImGuiContext *g;
  
  table = (ImGuiTable *)GImGui;
  pIStack_18 = GImGui->CurrentTable;
  if (pIStack_18 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4b3,"void ImGui::EndTable()");
  }
  if ((pIStack_18->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout(pIStack_18);
  }
  inner_window._4_4_ = pIStack_18->Flags;
  outer_window = pIStack_18->InnerWindow;
  temp_data = (ImGuiTableTempData *)pIStack_18->OuterWindow;
  _outer_padding_for_border = pIStack_18->TempData;
  if (outer_window != *(ImGuiWindow **)&table[0xe].Bg2ClipRectForDrawCmd.Max.y) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4c2,"void ImGui::EndTable()");
  }
  bVar5 = true;
  if ((ImGuiWindow *)temp_data != outer_window) {
    bVar5 = (ImGuiWindow *)temp_data == outer_window->ParentWindow;
  }
  if (!bVar5) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4c3,"void ImGui::EndTable()");
  }
  if ((pIStack_18->IsInsideRow & 1U) != 0) {
    TableEndRow(pIStack_18);
  }
  if (((((inner_window._4_4_ & 0x20) != 0) && (pIStack_18->HoveredColumnBody != -1)) &&
      (bVar5 = IsAnyItemHovered(), !bVar5)) && (bVar5 = IsMouseReleased(1), bVar5)) {
    TableOpenContextMenu((int)pIStack_18->HoveredColumnBody);
  }
  (outer_window->DC).PrevLineSize = _outer_padding_for_border->HostBackupPrevLineSize;
  (outer_window->DC).CurrLineSize = _outer_padding_for_border->HostBackupCurrLineSize;
  (outer_window->DC).CursorMaxPos = _outer_padding_for_border->HostBackupCursorMaxPos;
  max_pos_x = pIStack_18->RowPosY2;
  pfVar1 = &(outer_window->DC).CursorPos.y;
  if ((pIStack_18->RowPosY2 != *pfVar1) || (NAN(pIStack_18->RowPosY2) || NAN(*pfVar1))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4d2,"void ImGui::EndTable()");
  }
  if (outer_window == (ImGuiWindow *)temp_data) {
    if ((inner_window._4_4_ & 0x20000) == 0) {
      fVar6 = ImMax<float>((pIStack_18->OuterRect).Max.y,max_pos_x);
      (pIStack_18->InnerRect).Max.y = fVar6;
      (pIStack_18->OuterRect).Max.y = fVar6;
    }
  }
  else {
    (outer_window->DC).CursorMaxPos.y = max_pos_x;
  }
  fVar6 = ImMax<float>((pIStack_18->WorkRect).Max.y,(pIStack_18->OuterRect).Max.y);
  (pIStack_18->WorkRect).Max.y = fVar6;
  fVar6 = ImRect::GetHeight(&pIStack_18->OuterRect);
  pIStack_18->LastOuterHeight = fVar6;
  if ((pIStack_18->Flags & 0x1000000U) != 0) {
    local_b0 = 1.0;
    if ((pIStack_18->Flags & 0x400U) == 0) {
      local_b0 = 0.0;
    }
    local_40 = local_b0;
    fVar6 = (pIStack_18->InnerWindow->DC).CursorMaxPos.x;
    local_44 = fVar6;
    if (pIStack_18->RightMostEnabledColumn != -1) {
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                         (&pIStack_18->Columns,(int)pIStack_18->RightMostEnabledColumn);
      local_44 = ImMax<float>(fVar6,(pIVar3->WorkMaxX + pIStack_18->CellPaddingX +
                                    pIStack_18->OuterPaddingX) - local_40);
    }
    if (pIStack_18->ResizedColumn != -1) {
      local_44 = ImMax<float>(local_44,pIStack_18->ResizeLockMinContentsX2);
    }
    (pIStack_18->InnerWindow->DC).CursorMaxPos.x = local_44;
  }
  if ((inner_window._4_4_ & 0x100000) == 0) {
    ImDrawList::PopClipRect(outer_window->DrawList);
  }
  v = ImVector<ImVec4>::back(&outer_window->DrawList->_ClipRectStack);
  ImRect::ImRect((ImRect *)((long)&splitter + 4),v);
  (outer_window->ClipRect).Min = stack0xffffffffffffffac;
  (outer_window->ClipRect).Max = local_4c;
  if ((inner_window._4_4_ & 0x780) != 0) {
    TableDrawBorders(pIStack_18);
  }
  this = pIStack_18->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this,outer_window->DrawList,0);
  if ((pIStack_18->Flags & 0x100000U) == 0) {
    TableMergeDrawChannels(pIStack_18);
  }
  ImDrawListSplitter::Merge(this,outer_window->DrawList);
  pIStack_18->ColumnsAutoFitWidth =
       pIStack_18->CellPaddingX * 2.0 * (float)(int)pIStack_18->ColumnsEnabledCount +
       pIStack_18->OuterPaddingX + pIStack_18->OuterPaddingX +
       (pIStack_18->CellSpacingX1 + pIStack_18->CellSpacingX2) *
       (float)(pIStack_18->ColumnsEnabledCount + -1);
  for (column._0_4_ = 0; (int)column < pIStack_18->ColumnsCount; column._0_4_ = (int)column + 1) {
    if ((pIStack_18->EnabledMaskByIndex & 1L << ((byte)(int)column & 0x3f)) != 0) {
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&pIStack_18->Columns,(int)column);
      if (((pIVar3->Flags & 8U) == 0) || ((pIVar3->Flags & 0x10U) != 0)) {
        fVar6 = TableGetColumnWidthAuto(pIStack_18,pIVar3);
        pIStack_18->ColumnsAutoFitWidth = fVar6 + pIStack_18->ColumnsAutoFitWidth;
      }
      else {
        pIStack_18->ColumnsAutoFitWidth = pIVar3->WidthRequest + pIStack_18->ColumnsAutoFitWidth;
      }
    }
  }
  if (((pIStack_18->Flags & 0x1000000U) == 0) && (outer_window != (ImGuiWindow *)temp_data)) {
    (outer_window->Scroll).x = 0.0;
  }
  else if ((pIStack_18->LastResizedColumn != -1) &&
          (((pIStack_18->ResizedColumn == -1 && ((outer_window->ScrollbarX & 1U) != 0)) &&
           (pIStack_18->InstanceInteracted == pIStack_18->InstanceCurrent)))) {
    fVar6 = pIStack_18->CellPaddingX + pIStack_18->CellPaddingX + pIStack_18->MinColumnWidth;
    pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                       (&pIStack_18->Columns,(int)pIStack_18->LastResizedColumn);
    if ((pIStack_18->InnerClipRect).Min.x <= pIVar3->MaxX) {
      pIVar2 = &(pIStack_18->InnerClipRect).Max;
      if (pIVar2->x <= pIVar3->MaxX && pIVar3->MaxX != pIVar2->x) {
        SetScrollFromPosX(outer_window,(pIVar3->MaxX - (outer_window->Pos).x) + fVar6,1.0);
      }
    }
    else {
      SetScrollFromPosX(outer_window,(pIVar3->MaxX - (outer_window->Pos).x) - fVar6,1.0);
    }
  }
  if ((pIStack_18->ResizedColumn != -1) &&
     (pIStack_18->InstanceCurrent == pIStack_18->InstanceInteracted)) {
    pIVar3 = ImSpan<ImGuiTableColumn>::operator[]
                       (&pIStack_18->Columns,(int)pIStack_18->ResizedColumn);
    backup_outer_max_pos.y =
         ((table->InnerClipRect).Min.y - *(float *)&table[0xe].ContextPopupColumn) + 4.0;
    backup_outer_max_pos.x =
         ImFloor(-pIStack_18->CellPaddingX + -pIStack_18->CellPaddingX +
                 ((backup_outer_max_pos.y - pIVar3->MinX) - pIStack_18->CellSpacingX1));
    pIStack_18->ResizedColumnNextWidth = backup_outer_max_pos.x;
  }
  puVar4 = ImVector<unsigned_int>::back(&outer_window->IDStack);
  if (*puVar4 == pIStack_18->ID + (int)pIStack_18->InstanceCurrent) {
    if (*(int *)&temp_data[3].DrawSplitter._Channels.Data <
        _outer_padding_for_border->HostBackupItemWidthStackSize) {
      __assert_fail("(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x52d,"void ImGui::EndTable()");
    }
    PopID();
    local_98 = temp_data[1].HostBackupParentWorkRect.Max;
    (outer_window->WorkRect).Min = (_outer_padding_for_border->HostBackupWorkRect).Min;
    (outer_window->WorkRect).Max = (_outer_padding_for_border->HostBackupWorkRect).Max;
    (outer_window->ParentWorkRect).Min = (_outer_padding_for_border->HostBackupParentWorkRect).Min;
    (outer_window->ParentWorkRect).Max = (_outer_padding_for_border->HostBackupParentWorkRect).Max;
    outer_window->SkipItems = (bool)(pIStack_18->HostSkipItems & 1);
    temp_data[1].HostBackupWorkRect.Min = (pIStack_18->OuterRect).Min;
    temp_data[3].DrawSplitter._Count = (int)_outer_padding_for_border->HostBackupItemWidth;
    *(int *)&temp_data[3].DrawSplitter._Channels.Data =
         _outer_padding_for_border->HostBackupItemWidthStackSize;
    *(float *)&temp_data[1].field_0x8c = (_outer_padding_for_border->HostBackupColumnsOffset).x;
    if (outer_window == (ImGuiWindow *)temp_data) {
      _decoration_size_1 = ImRect::GetSize(&pIStack_18->OuterRect);
      ItemSize((ImVec2 *)&decoration_size_1,-1.0);
      ItemAdd(&pIStack_18->OuterRect,0,(ImRect *)0x0,0);
    }
    else {
      EndChild();
    }
    if ((pIStack_18->Flags & 0x10000U) == 0) {
      if (0.0 < (_outer_padding_for_border->UserOuterSize).x) {
        fVar6 = ImMax<float>(local_98.x,(pIStack_18->OuterRect).Max.x);
        temp_data[1].HostBackupParentWorkRect.Max.x = fVar6;
      }
      else {
        if ((pIStack_18->Flags & 0x1000000U) == 0) {
          local_c0 = 0.0;
        }
        else {
          local_c0 = (outer_window->ScrollbarSizes).x;
        }
        fVar6 = ImMax<float>(temp_data[1].HostBackupPrevLineSize.x,
                             ((pIStack_18->OuterRect).Min.x + pIStack_18->ColumnsAutoFitWidth +
                             local_c0) - (_outer_padding_for_border->UserOuterSize).x);
        temp_data[1].HostBackupPrevLineSize.x = fVar6;
        fVar6 = local_98.x;
        fVar7 = ImMin<float>((pIStack_18->OuterRect).Max.x,
                             (pIStack_18->OuterRect).Min.x + pIStack_18->ColumnsAutoFitWidth);
        fVar6 = ImMax<float>(fVar6,fVar7);
        temp_data[1].HostBackupParentWorkRect.Max.x = fVar6;
      }
    }
    else {
      if ((pIStack_18->Flags & 0x1000000U) != 0) {
        __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                      ,0x54c,"void ImGui::EndTable()");
      }
      fVar6 = ImMax<float>(local_98.x,
                           (pIStack_18->OuterRect).Min.x + pIStack_18->ColumnsAutoFitWidth);
      temp_data[1].HostBackupParentWorkRect.Max.x = fVar6;
    }
    if (0.0 < (_outer_padding_for_border->UserOuterSize).y) {
      fVar6 = ImMax<float>(local_98.y,(pIStack_18->OuterRect).Max.y);
      temp_data[1].HostBackupParentWorkRect.Max.y = fVar6;
    }
    else {
      if ((pIStack_18->Flags & 0x2000000U) == 0) {
        local_c8 = 0.0;
      }
      else {
        local_c8 = (outer_window->ScrollbarSizes).y;
      }
      fVar6 = ImMax<float>(temp_data[1].HostBackupPrevLineSize.y,
                           (max_pos_x + local_c8) - (_outer_padding_for_border->UserOuterSize).y);
      temp_data[1].HostBackupPrevLineSize.y = fVar6;
      fVar6 = local_98.y;
      fVar7 = ImMin<float>((pIStack_18->OuterRect).Max.y,max_pos_x);
      fVar6 = ImMax<float>(fVar6,fVar7);
      temp_data[1].HostBackupParentWorkRect.Max.y = fVar6;
    }
    if ((pIStack_18->IsSettingsDirty & 1U) != 0) {
      TableSaveSettings(pIStack_18);
    }
    pIStack_18->IsInitializing = false;
    bVar5 = false;
    if (*(ImGuiTableTempData **)&table[0xe].Bg2ClipRectForDrawCmd.Max.y == temp_data) {
      bVar5 = *(ImGuiTable **)&table[0x10].HostClipRect.Max.y == pIStack_18;
    }
    if (!bVar5) {
      __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x56b,"void ImGui::EndTable()");
    }
    if (-1 < (int)table[0x10].HostBackupInnerClipRect.Min.y) {
      table[0x10].HostBackupInnerClipRect.Min.y =
           (float)((int)table[0x10].HostBackupInnerClipRect.Min.y + -1);
      if ((int)table[0x10].HostBackupInnerClipRect.Min.y < 0) {
        local_d8 = (ImGuiTableTempData *)0x0;
      }
      else {
        local_d8 = ImVector<ImGuiTableTempData>::operator[]
                             ((ImVector<ImGuiTableTempData> *)&table[0x10].DrawSplitter,
                              (int)table[0x10].HostBackupInnerClipRect.Min.y);
      }
      _outer_padding_for_border = local_d8;
      if (local_d8 == (ImGuiTableTempData *)0x0) {
        local_e0 = (ImGuiTable *)0x0;
      }
      else {
        local_e0 = ImPool<ImGuiTable>::GetByIndex
                             ((ImPool<ImGuiTable> *)&table[0x10].HostBackupInnerClipRect.Max.y,
                              local_d8->TableIndex);
      }
      *(ImGuiTable **)&table[0x10].HostClipRect.Max.y = local_e0;
      if (*(long *)&table[0x10].HostClipRect.Max.y != 0) {
        *(ImGuiTableTempData **)(*(long *)&table[0x10].HostClipRect.Max.y + 0x10) =
             _outer_padding_for_border;
        *(ImDrawListSplitter **)(*(long *)&table[0x10].HostClipRect.Max.y + 0x1a8) =
             &_outer_padding_for_border->DrawSplitter;
      }
      if (*(long *)&table[0x10].HostClipRect.Max.y == 0) {
        local_e4 = -1;
      }
      else {
        local_e4 = ImPool<ImGuiTable>::GetIndex
                             ((ImPool<ImGuiTable> *)&table[0x10].HostBackupInnerClipRect.Max.y,
                              *(ImGuiTable **)&table[0x10].HostClipRect.Max.y);
      }
      temp_data[3].TableIndex = local_e4;
      return;
    }
    __assert_fail("g.CurrentTableStackIdx >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x56c,"void ImGui::EndTable()");
  }
  __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                ,0x52c,"void ImGui::EndTable()");
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.CurrentTableStackIdx >= 0);
    g.CurrentTableStackIdx--;
    temp_data = g.CurrentTableStackIdx >= 0 ? &g.TablesTempDataStack[g.CurrentTableStackIdx] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}